

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar14;
  int iVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  float fVar53;
  float fVar55;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar54;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar52;
  float fVar59;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar71;
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar78;
  float fVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar82;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar98;
  float fVar99;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar96;
  float fVar100;
  undefined1 auVar97 [16];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  float fVar108;
  float fVar109;
  undefined1 auVar106 [16];
  float fVar110;
  undefined1 auVar107 [16];
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar112 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [16];
  float fVar138;
  float fVar139;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  vbool<4> valid;
  undefined1 local_11f8 [16];
  undefined1 (*local_11e0) [16];
  ulong local_11d8;
  ulong local_11d0;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108 [4];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar18 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar58 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar88 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar110 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar132 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar138 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar145 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar151 = fVar132 * 0.99999964;
  fVar101 = fVar138 * 0.99999964;
  fVar150 = fVar145 * 0.99999964;
  fVar132 = fVar132 * 1.0000004;
  fVar138 = fVar138 * 1.0000004;
  fVar145 = fVar145 * 1.0000004;
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_11d0 = uVar24 ^ 0x10;
  iVar15 = (tray->tnear).field_0.i[k];
  auVar106._4_4_ = iVar15;
  auVar106._0_4_ = iVar15;
  auVar106._8_4_ = iVar15;
  auVar106._12_4_ = iVar15;
  iVar15 = (tray->tfar).field_0.i[k];
  auVar43._4_4_ = iVar15;
  auVar43._0_4_ = iVar15;
  auVar43._8_4_ = iVar15;
  auVar43._12_4_ = iVar15;
  local_11e0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1058 = fVar58;
  fStack_1054 = fVar58;
  fStack_1050 = fVar58;
  fStack_104c = fVar58;
  local_1068 = fVar88;
  fStack_1064 = fVar88;
  fStack_1060 = fVar88;
  fStack_105c = fVar88;
  local_1078 = fVar110;
  fStack_1074 = fVar110;
  fStack_1070 = fVar110;
  fStack_106c = fVar110;
  local_1088 = fVar132;
  fStack_1084 = fVar132;
  fStack_1080 = fVar132;
  fStack_107c = fVar132;
  local_1098 = fVar138;
  fStack_1094 = fVar138;
  fStack_1090 = fVar138;
  fStack_108c = fVar138;
  local_10a8 = fVar145;
  fStack_10a4 = fVar145;
  fStack_10a0 = fVar145;
  fStack_109c = fVar145;
  local_10b8 = fVar150;
  fStack_10b4 = fVar150;
  fStack_10b0 = fVar150;
  fStack_10ac = fVar150;
  local_10c8 = fVar151;
  fStack_10c4 = fVar151;
  fStack_10c0 = fVar151;
  fStack_10bc = fVar151;
  fVar111 = fVar138;
  fVar109 = fVar138;
  fVar108 = fVar138;
  fVar105 = fVar132;
  fVar100 = fVar132;
  fVar99 = fVar132;
  fVar98 = fVar58;
  fVar92 = fVar58;
  fVar87 = fVar58;
  fVar78 = fVar151;
  fVar77 = fVar151;
  fVar76 = fVar151;
  fVar68 = fVar150;
  fVar67 = fVar150;
  fVar66 = fVar150;
  fVar65 = fVar145;
  fVar59 = fVar145;
  fVar57 = fVar145;
  fVar56 = fVar110;
  fVar55 = fVar110;
  fVar54 = fVar110;
  fVar53 = fVar88;
  fVar32 = fVar88;
  fVar31 = fVar88;
LAB_00254976:
  do {
    pSVar14 = pSVar18 + -1;
    pSVar18 = pSVar18 + -1;
    if ((float)pSVar14->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar14->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar22 = (pSVar18->ptr).ptr;
      while ((uVar22 & 8) == 0) {
        pfVar1 = (float *)(uVar22 + 0x20 + uVar24);
        auVar33._0_4_ = (*pfVar1 - fVar87) * fVar76;
        auVar33._4_4_ = (pfVar1[1] - fVar92) * fVar77;
        auVar33._8_4_ = (pfVar1[2] - fVar98) * fVar78;
        auVar33._12_4_ = (pfVar1[3] - fVar58) * fVar151;
        pfVar1 = (float *)(uVar22 + 0x20 + uVar23);
        auVar94._0_4_ = (*pfVar1 - fVar31) * fVar101;
        auVar94._4_4_ = (pfVar1[1] - fVar32) * fVar101;
        auVar94._8_4_ = (pfVar1[2] - fVar53) * fVar101;
        auVar94._12_4_ = (pfVar1[3] - fVar88) * fVar101;
        auVar33 = maxps(auVar33,auVar94);
        pfVar1 = (float *)(uVar22 + 0x20 + uVar27);
        auVar95._0_4_ = (*pfVar1 - fVar54) * fVar66;
        auVar95._4_4_ = (pfVar1[1] - fVar55) * fVar67;
        auVar95._8_4_ = (pfVar1[2] - fVar56) * fVar68;
        auVar95._12_4_ = (pfVar1[3] - fVar110) * fVar150;
        auVar69 = maxps(auVar95,auVar106);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar33,auVar69);
        pfVar1 = (float *)(uVar22 + 0x20 + local_11d0);
        auVar103._0_4_ = (*pfVar1 - fVar87) * fVar99;
        auVar103._4_4_ = (pfVar1[1] - fVar92) * fVar100;
        auVar103._8_4_ = (pfVar1[2] - fVar98) * fVar105;
        auVar103._12_4_ = (pfVar1[3] - fVar58) * fVar132;
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar23 ^ 0x10));
        auVar79._0_4_ = (*pfVar1 - fVar31) * fVar108;
        auVar79._4_4_ = (pfVar1[1] - fVar32) * fVar109;
        auVar79._8_4_ = (pfVar1[2] - fVar53) * fVar111;
        auVar79._12_4_ = (pfVar1[3] - fVar88) * fVar138;
        auVar33 = minps(auVar103,auVar79);
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar27 ^ 0x10));
        auVar80._0_4_ = (*pfVar1 - fVar54) * fVar57;
        auVar80._4_4_ = (pfVar1[1] - fVar55) * fVar59;
        auVar80._8_4_ = (pfVar1[2] - fVar56) * fVar65;
        auVar80._12_4_ = (pfVar1[3] - fVar110) * fVar145;
        auVar69 = minps(auVar80,auVar43);
        auVar33 = minps(auVar33,auVar69);
        auVar69._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar33._4_4_);
        auVar69._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar33._0_4_);
        auVar69._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar33._8_4_);
        auVar69._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar33._12_4_);
        uVar20 = movmskps((int)local_11d0,auVar69);
        if (uVar20 == 0) {
          if (pSVar18 == stack) {
            return;
          }
          goto LAB_00254976;
        }
        uVar20 = uVar20 & 0xff;
        uVar25 = uVar22 & 0xfffffffffffffff0;
        lVar21 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        uVar22 = *(ulong *)(uVar25 + lVar21 * 8);
        uVar20 = uVar20 - 1 & uVar20;
        if (uVar20 != 0) {
          uVar28 = tNear.field_0.i[lVar21];
          lVar21 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar26 = *(ulong *)(uVar25 + lVar21 * 8);
          uVar29 = tNear.field_0.i[lVar21];
          uVar20 = uVar20 - 1 & uVar20;
          if (uVar20 == 0) {
            if (uVar28 < uVar29) {
              (pSVar18->ptr).ptr = uVar26;
              pSVar18->dist = uVar29;
              pSVar18 = pSVar18 + 1;
            }
            else {
              (pSVar18->ptr).ptr = uVar22;
              pSVar18->dist = uVar28;
              pSVar18 = pSVar18 + 1;
              uVar22 = uVar26;
            }
          }
          else {
            auVar70._8_4_ = uVar28;
            auVar70._0_8_ = uVar22;
            auVar70._12_4_ = 0;
            auVar89._8_4_ = uVar29;
            auVar89._0_8_ = uVar26;
            auVar89._12_4_ = 0;
            lVar21 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar6 = *(undefined8 *)(uVar25 + lVar21 * 8);
            iVar15 = tNear.field_0.i[lVar21];
            auVar81._8_4_ = iVar15;
            auVar81._0_8_ = uVar6;
            auVar81._12_4_ = 0;
            auVar34._8_4_ = -(uint)((int)uVar28 < (int)uVar29);
            uVar20 = uVar20 - 1 & uVar20;
            if (uVar20 == 0) {
              auVar34._4_4_ = auVar34._8_4_;
              auVar34._0_4_ = auVar34._8_4_;
              auVar34._12_4_ = auVar34._8_4_;
              auVar93._8_4_ = uVar29;
              auVar93._0_8_ = uVar26;
              auVar93._12_4_ = 0;
              auVar94 = blendvps(auVar93,auVar70,auVar34);
              auVar33 = blendvps(auVar70,auVar89,auVar34);
              auVar35._8_4_ = -(uint)(auVar94._8_4_ < iVar15);
              auVar35._4_4_ = auVar35._8_4_;
              auVar35._0_4_ = auVar35._8_4_;
              auVar35._12_4_ = auVar35._8_4_;
              auVar90._8_4_ = iVar15;
              auVar90._0_8_ = uVar6;
              auVar90._12_4_ = 0;
              auVar69 = blendvps(auVar90,auVar94,auVar35);
              auVar94 = blendvps(auVar94,auVar81,auVar35);
              auVar36._8_4_ = -(uint)(auVar33._8_4_ < auVar94._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              SVar82 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar94,auVar33,auVar36);
              SVar71 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar33,auVar94,auVar36);
              *pSVar18 = SVar71;
              pSVar18[1] = SVar82;
              uVar22 = auVar69._0_8_;
              pSVar18 = pSVar18 + 2;
            }
            else {
              lVar21 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              auVar37._4_4_ = auVar34._8_4_;
              auVar37._0_4_ = auVar34._8_4_;
              auVar37._8_4_ = auVar34._8_4_;
              auVar37._12_4_ = auVar34._8_4_;
              auVar95 = blendvps(auVar89,auVar70,auVar37);
              auVar33 = blendvps(auVar70,auVar89,auVar37);
              auVar102._8_4_ = tNear.field_0.i[lVar21];
              auVar102._0_8_ = *(undefined8 *)(uVar25 + lVar21 * 8);
              auVar102._12_4_ = 0;
              auVar38._8_4_ = -(uint)(iVar15 < tNear.field_0.i[lVar21]);
              auVar38._4_4_ = auVar38._8_4_;
              auVar38._0_4_ = auVar38._8_4_;
              auVar38._12_4_ = auVar38._8_4_;
              auVar94 = blendvps(auVar102,auVar81,auVar38);
              auVar69 = blendvps(auVar81,auVar102,auVar38);
              auVar39._8_4_ = -(uint)(auVar33._8_4_ < auVar69._8_4_);
              auVar39._4_4_ = auVar39._8_4_;
              auVar39._0_4_ = auVar39._8_4_;
              auVar39._12_4_ = auVar39._8_4_;
              auVar103 = blendvps(auVar69,auVar33,auVar39);
              SVar71 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar33,auVar69,auVar39);
              auVar40._8_4_ = -(uint)(auVar95._8_4_ < auVar94._8_4_);
              auVar40._4_4_ = auVar40._8_4_;
              auVar40._0_4_ = auVar40._8_4_;
              auVar40._12_4_ = auVar40._8_4_;
              auVar33 = blendvps(auVar94,auVar95,auVar40);
              auVar69 = blendvps(auVar95,auVar94,auVar40);
              auVar41._8_4_ = -(uint)(auVar69._8_4_ < auVar103._8_4_);
              auVar41._4_4_ = auVar41._8_4_;
              auVar41._0_4_ = auVar41._8_4_;
              auVar41._12_4_ = auVar41._8_4_;
              SVar82 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar103,auVar69,auVar41);
              SVar96 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar69,auVar103,auVar41);
              *pSVar18 = SVar71;
              pSVar18[1] = SVar96;
              pSVar18[2] = SVar82;
              uVar22 = auVar33._0_8_;
              pSVar18 = pSVar18 + 3;
            }
          }
        }
      }
      uVar25 = (ulong)((uint)uVar22 & 0xf) - 8;
      if (uVar25 != 0) {
        uVar22 = uVar22 & 0xfffffffffffffff0;
        uVar26 = 0;
        local_11d8 = uVar25;
        do {
          lVar21 = uVar26 * 0xb0;
          fVar58 = *(float *)(ray + k * 4);
          fVar88 = *(float *)(ray + k * 4 + 0x10);
          fVar110 = *(float *)(ray + k * 4 + 0x20);
          pfVar1 = (float *)(uVar22 + lVar21);
          pfVar2 = (float *)(uVar22 + 0x10 + lVar21);
          pfVar3 = (float *)(uVar22 + 0x20 + lVar21);
          pfVar4 = (float *)(uVar22 + 0x30 + lVar21);
          fVar152 = *pfVar1 - fVar58;
          fVar154 = pfVar1[1] - fVar58;
          fVar156 = pfVar1[2] - fVar58;
          fVar158 = pfVar1[3] - fVar58;
          fVar124 = *pfVar2 - fVar88;
          fVar126 = pfVar2[1] - fVar88;
          fVar128 = pfVar2[2] - fVar88;
          fVar130 = pfVar2[3] - fVar88;
          fVar146 = *pfVar3 - fVar110;
          fVar147 = pfVar3[1] - fVar110;
          fVar148 = pfVar3[2] - fVar110;
          fVar149 = pfVar3[3] - fVar110;
          fVar31 = *pfVar4 - fVar58;
          fVar53 = pfVar4[1] - fVar58;
          fVar55 = pfVar4[2] - fVar58;
          fVar57 = pfVar4[3] - fVar58;
          pfVar1 = (float *)(uVar22 + 0x40 + lVar21);
          fVar68 = *pfVar1 - fVar88;
          fVar150 = pfVar1[1] - fVar88;
          fVar76 = pfVar1[2] - fVar88;
          fVar77 = pfVar1[3] - fVar88;
          pfVar1 = (float *)(uVar22 + 0x50 + lVar21);
          fVar92 = *pfVar1 - fVar110;
          fVar98 = pfVar1[1] - fVar110;
          fVar99 = pfVar1[2] - fVar110;
          fVar100 = pfVar1[3] - fVar110;
          pfVar1 = (float *)(uVar22 + 0x60 + lVar21);
          fVar32 = *pfVar1 - fVar58;
          fVar54 = pfVar1[1] - fVar58;
          fVar56 = pfVar1[2] - fVar58;
          fVar58 = pfVar1[3] - fVar58;
          pfVar1 = (float *)(uVar22 + 0x70 + lVar21);
          fVar78 = *pfVar1 - fVar88;
          fVar151 = pfVar1[1] - fVar88;
          fVar87 = pfVar1[2] - fVar88;
          fVar88 = pfVar1[3] - fVar88;
          pfVar1 = (float *)(uVar22 + 0x80 + lVar21);
          fVar105 = *pfVar1 - fVar110;
          fVar108 = pfVar1[1] - fVar110;
          fVar109 = pfVar1[2] - fVar110;
          fVar110 = pfVar1[3] - fVar110;
          fVar116 = fVar32 - fVar152;
          fVar118 = fVar54 - fVar154;
          fVar120 = fVar56 - fVar156;
          fVar122 = fVar58 - fVar158;
          fVar139 = fVar78 - fVar124;
          fVar142 = fVar151 - fVar126;
          fVar143 = fVar87 - fVar128;
          fVar144 = fVar88 - fVar130;
          local_1018 = fVar105 - fVar146;
          fStack_1014 = fVar108 - fVar147;
          fStack_1010 = fVar109 - fVar148;
          fStack_100c = fVar110 - fVar149;
          fVar132 = *(float *)(ray + k * 4 + 0x50);
          fVar138 = *(float *)(ray + k * 4 + 0x60);
          fVar145 = *(float *)(ray + k * 4 + 0x40);
          local_1048 = (fVar139 * (fVar146 + fVar105) - (fVar124 + fVar78) * local_1018) * fVar145 +
                       ((fVar152 + fVar32) * local_1018 - (fVar146 + fVar105) * fVar116) * fVar132 +
                       (fVar116 * (fVar124 + fVar78) - (fVar152 + fVar32) * fVar139) * fVar138;
          fStack_1044 = (fVar142 * (fVar147 + fVar108) - (fVar126 + fVar151) * fStack_1014) *
                        fVar145 + ((fVar154 + fVar54) * fStack_1014 - (fVar147 + fVar108) * fVar118)
                                  * fVar132 +
                                  (fVar118 * (fVar126 + fVar151) - (fVar154 + fVar54) * fVar142) *
                                  fVar138;
          fStack_1040 = (fVar143 * (fVar148 + fVar109) - (fVar128 + fVar87) * fStack_1010) * fVar145
                        + ((fVar156 + fVar56) * fStack_1010 - (fVar148 + fVar109) * fVar120) *
                          fVar132 + (fVar120 * (fVar128 + fVar87) - (fVar156 + fVar56) * fVar143) *
                                    fVar138;
          fStack_103c = (fVar144 * (fVar149 + fVar110) - (fVar130 + fVar88) * fStack_100c) * fVar145
                        + ((fVar158 + fVar58) * fStack_100c - (fVar149 + fVar110) * fVar122) *
                          fVar132 + (fVar122 * (fVar130 + fVar88) - (fVar158 + fVar58) * fVar144) *
                                    fVar138;
          fVar59 = fVar152 - fVar31;
          fVar65 = fVar154 - fVar53;
          fVar66 = fVar156 - fVar55;
          fVar67 = fVar158 - fVar57;
          fVar111 = fVar124 - fVar68;
          fVar113 = fVar126 - fVar150;
          fVar114 = fVar128 - fVar76;
          fVar115 = fVar130 - fVar77;
          fVar133 = fVar146 - fVar92;
          fVar135 = fVar147 - fVar98;
          fVar136 = fVar148 - fVar99;
          fVar137 = fVar149 - fVar100;
          local_1028._0_4_ =
               (fVar111 * (fVar146 + fVar92) - (fVar124 + fVar68) * fVar133) * fVar145 +
               ((fVar152 + fVar31) * fVar133 - (fVar146 + fVar92) * fVar59) * fVar132 +
               (fVar59 * (fVar124 + fVar68) - (fVar152 + fVar31) * fVar111) * fVar138;
          local_1028._4_4_ =
               (fVar113 * (fVar147 + fVar98) - (fVar126 + fVar150) * fVar135) * fVar145 +
               ((fVar154 + fVar53) * fVar135 - (fVar147 + fVar98) * fVar65) * fVar132 +
               (fVar65 * (fVar126 + fVar150) - (fVar154 + fVar53) * fVar113) * fVar138;
          local_1028._8_4_ =
               (fVar114 * (fVar148 + fVar99) - (fVar128 + fVar76) * fVar136) * fVar145 +
               ((fVar156 + fVar55) * fVar136 - (fVar148 + fVar99) * fVar66) * fVar132 +
               (fVar66 * (fVar128 + fVar76) - (fVar156 + fVar55) * fVar114) * fVar138;
          local_1028._12_4_ =
               (fVar115 * (fVar149 + fVar100) - (fVar130 + fVar77) * fVar137) * fVar145 +
               ((fVar158 + fVar57) * fVar137 - (fVar149 + fVar100) * fVar67) * fVar132 +
               (fVar67 * (fVar130 + fVar77) - (fVar158 + fVar57) * fVar115) * fVar138;
          fVar117 = fVar31 - fVar32;
          fVar119 = fVar53 - fVar54;
          fVar121 = fVar55 - fVar56;
          fVar123 = fVar57 - fVar58;
          fVar153 = fVar68 - fVar78;
          fVar155 = fVar150 - fVar151;
          fVar157 = fVar76 - fVar87;
          fVar159 = fVar77 - fVar88;
          fVar125 = fVar92 - fVar105;
          fVar127 = fVar98 - fVar108;
          fVar129 = fVar99 - fVar109;
          fVar131 = fVar100 - fVar110;
          auVar72._0_4_ =
               (fVar153 * (fVar105 + fVar92) - (fVar78 + fVar68) * fVar125) * fVar145 +
               ((fVar32 + fVar31) * fVar125 - (fVar105 + fVar92) * fVar117) * fVar132 +
               (fVar117 * (fVar78 + fVar68) - (fVar32 + fVar31) * fVar153) * fVar138;
          auVar72._4_4_ =
               (fVar155 * (fVar108 + fVar98) - (fVar151 + fVar150) * fVar127) * fVar145 +
               ((fVar54 + fVar53) * fVar127 - (fVar108 + fVar98) * fVar119) * fVar132 +
               (fVar119 * (fVar151 + fVar150) - (fVar54 + fVar53) * fVar155) * fVar138;
          auVar72._8_4_ =
               (fVar157 * (fVar109 + fVar99) - (fVar87 + fVar76) * fVar129) * fVar145 +
               ((fVar56 + fVar55) * fVar129 - (fVar109 + fVar99) * fVar121) * fVar132 +
               (fVar121 * (fVar87 + fVar76) - (fVar56 + fVar55) * fVar157) * fVar138;
          auVar72._12_4_ =
               (fVar159 * (fVar110 + fVar100) - (fVar88 + fVar77) * fVar131) * fVar145 +
               ((fVar58 + fVar57) * fVar131 - (fVar110 + fVar100) * fVar123) * fVar132 +
               (fVar123 * (fVar88 + fVar77) - (fVar58 + fVar57) * fVar159) * fVar138;
          local_1038 = local_1028._0_4_ + local_1048 + auVar72._0_4_;
          fStack_1034 = local_1028._4_4_ + fStack_1044 + auVar72._4_4_;
          fStack_1030 = local_1028._8_4_ + fStack_1040 + auVar72._8_4_;
          fStack_102c = local_1028._12_4_ + fStack_103c + auVar72._12_4_;
          auVar42._4_4_ = fStack_1044;
          auVar42._0_4_ = local_1048;
          auVar42._8_4_ = fStack_1040;
          auVar42._12_4_ = fStack_103c;
          auVar43 = minps(auVar42,local_1028);
          auVar43 = minps(auVar43,auVar72);
          auVar83._4_4_ = fStack_1044;
          auVar83._0_4_ = local_1048;
          auVar83._8_4_ = fStack_1040;
          auVar83._12_4_ = fStack_103c;
          auVar33 = maxps(auVar83,local_1028);
          auVar33 = maxps(auVar33,auVar72);
          fVar58 = ABS(local_1038) * 1.1920929e-07;
          fVar88 = ABS(fStack_1034) * 1.1920929e-07;
          fVar110 = ABS(fStack_1030) * 1.1920929e-07;
          fVar31 = ABS(fStack_102c) * 1.1920929e-07;
          auVar84._4_4_ = -(uint)(auVar33._4_4_ <= fVar88);
          auVar84._0_4_ = -(uint)(auVar33._0_4_ <= fVar58);
          auVar84._8_4_ = -(uint)(auVar33._8_4_ <= fVar110);
          auVar84._12_4_ = -(uint)(auVar33._12_4_ <= fVar31);
          auVar44._4_4_ = -(uint)(-fVar88 <= auVar43._4_4_);
          auVar44._0_4_ = -(uint)(-fVar58 <= auVar43._0_4_);
          auVar44._8_4_ = -(uint)(-fVar110 <= auVar43._8_4_);
          auVar44._12_4_ = -(uint)(-fVar31 <= auVar43._12_4_);
          auVar84 = auVar84 | auVar44;
          uVar20 = movmskps((int)uVar25,auVar84);
          uVar25 = (ulong)uVar20;
          if (uVar20 != 0) {
            auVar97._0_4_ = fVar139 * fVar133 - fVar111 * local_1018;
            auVar97._4_4_ = fVar142 * fVar135 - fVar113 * fStack_1014;
            auVar97._8_4_ = fVar143 * fVar136 - fVar114 * fStack_1010;
            auVar97._12_4_ = fVar144 * fVar137 - fVar115 * fStack_100c;
            auVar112._0_4_ = fVar111 * fVar125 - fVar133 * fVar153;
            auVar112._4_4_ = fVar113 * fVar127 - fVar135 * fVar155;
            auVar112._8_4_ = fVar114 * fVar129 - fVar136 * fVar157;
            auVar112._12_4_ = fVar115 * fVar131 - fVar137 * fVar159;
            auVar45._4_4_ = -(uint)(ABS(fVar113 * fStack_1014) < ABS(fVar135 * fVar155));
            auVar45._0_4_ = -(uint)(ABS(fVar111 * local_1018) < ABS(fVar133 * fVar153));
            auVar45._8_4_ = -(uint)(ABS(fVar114 * fStack_1010) < ABS(fVar136 * fVar157));
            auVar45._12_4_ = -(uint)(ABS(fVar115 * fStack_100c) < ABS(fVar137 * fVar159));
            local_10f8 = blendvps(auVar112,auVar97,auVar45);
            auVar91._0_4_ = local_1018 * fVar59 - fVar133 * fVar116;
            auVar91._4_4_ = fStack_1014 * fVar65 - fVar135 * fVar118;
            auVar91._8_4_ = fStack_1010 * fVar66 - fVar136 * fVar120;
            auVar91._12_4_ = fStack_100c * fVar67 - fVar137 * fVar122;
            auVar134._0_4_ = fVar133 * fVar117 - fVar59 * fVar125;
            auVar134._4_4_ = fVar135 * fVar119 - fVar65 * fVar127;
            auVar134._8_4_ = fVar136 * fVar121 - fVar66 * fVar129;
            auVar134._12_4_ = fVar137 * fVar123 - fVar67 * fVar131;
            auVar46._4_4_ = -(uint)(ABS(fVar135 * fVar118) < ABS(fVar65 * fVar127));
            auVar46._0_4_ = -(uint)(ABS(fVar133 * fVar116) < ABS(fVar59 * fVar125));
            auVar46._8_4_ = -(uint)(ABS(fVar136 * fVar120) < ABS(fVar66 * fVar129));
            auVar46._12_4_ = -(uint)(ABS(fVar137 * fVar122) < ABS(fVar67 * fVar131));
            local_10e8 = blendvps(auVar134,auVar91,auVar46);
            auVar104._0_4_ = fVar59 * fVar153 - fVar111 * fVar117;
            auVar104._4_4_ = fVar65 * fVar155 - fVar113 * fVar119;
            auVar104._8_4_ = fVar66 * fVar157 - fVar114 * fVar121;
            auVar104._12_4_ = fVar67 * fVar159 - fVar115 * fVar123;
            auVar47._4_4_ = -(uint)(ABS(fVar65 * fVar142) < ABS(fVar113 * fVar119));
            auVar47._0_4_ = -(uint)(ABS(fVar59 * fVar139) < ABS(fVar111 * fVar117));
            auVar47._8_4_ = -(uint)(ABS(fVar66 * fVar143) < ABS(fVar114 * fVar121));
            auVar47._12_4_ = -(uint)(ABS(fVar67 * fVar144) < ABS(fVar115 * fVar123));
            auVar12._4_4_ = fVar118 * fVar113 - fVar65 * fVar142;
            auVar12._0_4_ = fVar116 * fVar111 - fVar59 * fVar139;
            auVar12._8_4_ = fVar120 * fVar114 - fVar66 * fVar143;
            auVar12._12_4_ = fVar122 * fVar115 - fVar67 * fVar144;
            local_10d8 = blendvps(auVar104,auVar12,auVar47);
            fVar58 = fVar145 * local_10f8._0_4_ +
                     fVar132 * local_10e8._0_4_ + fVar138 * local_10d8._0_4_;
            fVar88 = fVar145 * local_10f8._4_4_ +
                     fVar132 * local_10e8._4_4_ + fVar138 * local_10d8._4_4_;
            fVar110 = fVar145 * local_10f8._8_4_ +
                      fVar132 * local_10e8._8_4_ + fVar138 * local_10d8._8_4_;
            fVar132 = fVar145 * local_10f8._12_4_ +
                      fVar132 * local_10e8._12_4_ + fVar138 * local_10d8._12_4_;
            auVar140._0_4_ = fVar58 + fVar58;
            auVar140._4_4_ = fVar88 + fVar88;
            auVar140._8_4_ = fVar110 + fVar110;
            auVar140._12_4_ = fVar132 + fVar132;
            auVar48._0_4_ = fVar124 * local_10e8._0_4_ + fVar146 * local_10d8._0_4_;
            auVar48._4_4_ = fVar126 * local_10e8._4_4_ + fVar147 * local_10d8._4_4_;
            auVar48._8_4_ = fVar128 * local_10e8._8_4_ + fVar148 * local_10d8._8_4_;
            auVar48._12_4_ = fVar130 * local_10e8._12_4_ + fVar149 * local_10d8._12_4_;
            fVar138 = fVar152 * local_10f8._0_4_ + auVar48._0_4_;
            fVar145 = fVar154 * local_10f8._4_4_ + auVar48._4_4_;
            fVar31 = fVar156 * local_10f8._8_4_ + auVar48._8_4_;
            fVar32 = fVar158 * local_10f8._12_4_ + auVar48._12_4_;
            auVar43 = rcpps(auVar48,auVar140);
            fVar58 = auVar43._0_4_;
            fVar88 = auVar43._4_4_;
            fVar110 = auVar43._8_4_;
            fVar132 = auVar43._12_4_;
            fVar138 = ((1.0 - auVar140._0_4_ * fVar58) * fVar58 + fVar58) * (fVar138 + fVar138);
            fVar145 = ((1.0 - auVar140._4_4_ * fVar88) * fVar88 + fVar88) * (fVar145 + fVar145);
            fVar110 = ((1.0 - auVar140._8_4_ * fVar110) * fVar110 + fVar110) * (fVar31 + fVar31);
            fVar132 = ((1.0 - auVar140._12_4_ * fVar132) * fVar132 + fVar132) * (fVar32 + fVar32);
            fVar88 = *(float *)(ray + k * 4 + 0x80);
            fVar58 = *(float *)(ray + k * 4 + 0x30);
            auVar60._4_4_ = -(uint)(fVar58 <= fVar145);
            auVar60._0_4_ = -(uint)(fVar58 <= fVar138);
            auVar60._8_4_ = -(uint)(fVar58 <= fVar110);
            auVar60._12_4_ = -(uint)(fVar58 <= fVar132);
            auVar49._0_4_ = -(uint)(fVar138 <= fVar88 && fVar58 <= fVar138) & auVar84._0_4_;
            auVar49._4_4_ = -(uint)(fVar145 <= fVar88 && fVar58 <= fVar145) & auVar84._4_4_;
            auVar49._8_4_ = -(uint)(fVar110 <= fVar88 && fVar58 <= fVar110) & auVar84._8_4_;
            auVar49._12_4_ = -(uint)(fVar132 <= fVar88 && fVar58 <= fVar132) & auVar84._12_4_;
            uVar20 = movmskps(uVar20,auVar49);
            uVar25 = (ulong)uVar20;
            if (uVar20 != 0) {
              valid.field_0.i[0] = auVar49._0_4_ & -(uint)(auVar140._0_4_ != 0.0);
              valid.field_0.i[1] = auVar49._4_4_ & -(uint)(auVar140._4_4_ != 0.0);
              valid.field_0.i[2] = auVar49._8_4_ & -(uint)(auVar140._8_4_ != 0.0);
              valid.field_0.i[3] = auVar49._12_4_ & -(uint)(auVar140._12_4_ != 0.0);
              uVar20 = movmskps(uVar20,(undefined1  [16])valid.field_0);
              uVar25 = (ulong)uVar20;
              if (uVar20 != 0) {
                tNear.field_0.v[1] = fStack_1044;
                tNear.field_0.v[0] = local_1048;
                tNear.field_0.v[2] = fStack_1040;
                tNear.field_0.v[3] = fStack_103c;
                auVar13._4_4_ = fStack_1034;
                auVar13._0_4_ = local_1038;
                auVar13._8_4_ = fStack_1030;
                auVar13._12_4_ = fStack_102c;
                local_1108[0] = fVar138;
                local_1108[1] = fVar145;
                local_1108[2] = fVar110;
                local_1108[3] = fVar132;
                pSVar7 = context->scene;
                auVar43 = rcpps(auVar60,auVar13);
                fVar58 = auVar43._0_4_;
                fVar31 = auVar43._4_4_;
                fVar32 = auVar43._8_4_;
                fVar53 = auVar43._12_4_;
                fVar58 = (float)(-(uint)(1e-18 <= ABS(local_1038)) &
                                (uint)(((float)DAT_01f7ba10 - local_1038 * fVar58) * fVar58 + fVar58
                                      ));
                fVar31 = (float)(-(uint)(1e-18 <= ABS(fStack_1034)) &
                                (uint)((DAT_01f7ba10._4_4_ - fStack_1034 * fVar31) * fVar31 + fVar31
                                      ));
                fVar32 = (float)(-(uint)(1e-18 <= ABS(fStack_1030)) &
                                (uint)((DAT_01f7ba10._8_4_ - fStack_1030 * fVar32) * fVar32 + fVar32
                                      ));
                fVar53 = (float)(-(uint)(1e-18 <= ABS(fStack_102c)) &
                                (uint)((DAT_01f7ba10._12_4_ - fStack_102c * fVar53) * fVar53 +
                                      fVar53));
                auVar141._0_4_ = local_1048 * fVar58;
                auVar141._4_4_ = fStack_1044 * fVar31;
                auVar141._8_4_ = fStack_1040 * fVar32;
                auVar141._12_4_ = fStack_103c * fVar53;
                local_1128 = minps(auVar141,_DAT_01f7ba10);
                auVar107._0_4_ = fVar58 * local_1028._0_4_;
                auVar107._4_4_ = fVar31 * local_1028._4_4_;
                auVar107._8_4_ = fVar32 * local_1028._8_4_;
                auVar107._12_4_ = fVar53 * local_1028._12_4_;
                local_1118 = minps(auVar107,_DAT_01f7ba10);
                auVar10._4_4_ = fVar145;
                auVar10._0_4_ = fVar138;
                auVar10._8_4_ = fVar110;
                auVar10._12_4_ = fVar132;
                auVar33 = blendvps(_DAT_01f7a9f0,auVar10,(undefined1  [16])valid.field_0);
                auVar85._4_4_ = auVar33._0_4_;
                auVar85._0_4_ = auVar33._4_4_;
                auVar85._8_4_ = auVar33._12_4_;
                auVar85._12_4_ = auVar33._8_4_;
                auVar43 = minps(auVar85,auVar33);
                auVar61._0_8_ = auVar43._8_8_;
                auVar61._8_4_ = auVar43._0_4_;
                auVar61._12_4_ = auVar43._4_4_;
                auVar43 = minps(auVar61,auVar43);
                uVar20 = -(uint)(auVar43._0_4_ == auVar33._0_4_);
                uVar28 = -(uint)(auVar43._4_4_ == auVar33._4_4_);
                uVar29 = -(uint)(auVar43._8_4_ == auVar33._8_4_);
                uVar30 = -(uint)(auVar43._12_4_ == auVar33._12_4_);
                auVar75._4_4_ = uVar28;
                auVar75._0_4_ = uVar20;
                auVar73._0_4_ = uVar20 & valid.field_0.i[0];
                auVar73._4_4_ = uVar28 & valid.field_0.i[1];
                auVar73._8_4_ = uVar29 & valid.field_0.i[2];
                auVar73._12_4_ = uVar30 & valid.field_0.i[3];
                iVar15 = movmskps((int)pSVar7,auVar73);
                auVar74._8_4_ = 0xffffffff;
                auVar74._0_8_ = 0xffffffffffffffff;
                auVar74._12_4_ = 0xffffffff;
                if (iVar15 != 0) {
                  auVar75._8_4_ = uVar29;
                  auVar75._12_4_ = uVar30;
                  auVar74 = auVar75;
                }
                lVar21 = lVar21 + uVar22;
                auVar50._0_4_ = valid.field_0.i[0] & auVar74._0_4_;
                auVar50._4_4_ = valid.field_0.i[1] & auVar74._4_4_;
                auVar50._8_4_ = valid.field_0.i[2] & auVar74._8_4_;
                auVar50._12_4_ = valid.field_0.i[3] & auVar74._12_4_;
                uVar16 = movmskps(iVar15,auVar50);
                uVar25 = CONCAT44((int)((ulong)pSVar7 >> 0x20),uVar16);
                lVar19 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
LAB_002551a1:
                uVar20 = *(uint *)(lVar21 + 0x90 + lVar19 * 4);
                pGVar8 = (pSVar7->geometries).items[uVar20].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar19] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar16 = *(undefined4 *)(local_1128 + lVar19 * 4);
                    fVar58 = local_1108[lVar19 + -4];
                    *(float *)(ray + k * 4 + 0x80) = local_1108[lVar19];
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10f8 + lVar19 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10e8 + lVar19 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_10d8 + lVar19 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar16;
                    *(float *)(ray + k * 4 + 0x100) = fVar58;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)(lVar21 + 0xa0 + lVar19 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar20;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar20 = context->user->instPrimID[0];
                    uVar25 = (ulong)uVar20;
                    *(uint *)(ray + k * 4 + 0x140) = uVar20;
                    goto LAB_00255698;
                  }
                  local_fd8 = *(undefined4 *)(local_1128 + lVar19 * 4);
                  local_fc8 = local_1108[lVar19 + -4];
                  uVar16 = *(undefined4 *)(local_10f8 + lVar19 * 4);
                  uVar17 = *(undefined4 *)(local_10e8 + lVar19 * 4);
                  local_fa8._4_4_ = uVar20;
                  local_fa8._0_4_ = uVar20;
                  local_fa8._8_4_ = uVar20;
                  local_fa8._12_4_ = uVar20;
                  uVar5 = *(undefined4 *)(lVar21 + 0xa0 + lVar19 * 4);
                  local_fb8._4_4_ = uVar5;
                  local_fb8._0_4_ = uVar5;
                  local_fb8._8_4_ = uVar5;
                  local_fb8._12_4_ = uVar5;
                  local_ff8._4_4_ = uVar17;
                  local_ff8._0_4_ = uVar17;
                  local_ff8._8_4_ = uVar17;
                  local_ff8._12_4_ = uVar17;
                  uVar17 = *(undefined4 *)(local_10d8 + lVar19 * 4);
                  local_fe8._4_4_ = uVar17;
                  local_fe8._0_4_ = uVar17;
                  local_fe8._8_4_ = uVar17;
                  local_fe8._12_4_ = uVar17;
                  local_1008[0] = (RTCHitN)(char)uVar16;
                  local_1008[1] = (RTCHitN)(char)((uint)uVar16 >> 8);
                  local_1008[2] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
                  local_1008[3] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
                  local_1008[4] = (RTCHitN)(char)uVar16;
                  local_1008[5] = (RTCHitN)(char)((uint)uVar16 >> 8);
                  local_1008[6] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
                  local_1008[7] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
                  local_1008[8] = (RTCHitN)(char)uVar16;
                  local_1008[9] = (RTCHitN)(char)((uint)uVar16 >> 8);
                  local_1008[10] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
                  local_1008[0xb] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
                  local_1008[0xc] = (RTCHitN)(char)uVar16;
                  local_1008[0xd] = (RTCHitN)(char)((uint)uVar16 >> 8);
                  local_1008[0xe] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
                  local_1008[0xf] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
                  uStack_fd4 = local_fd8;
                  uStack_fd0 = local_fd8;
                  uStack_fcc = local_fd8;
                  fStack_fc4 = local_fc8;
                  fStack_fc0 = local_fc8;
                  fStack_fbc = local_fc8;
                  local_f98 = context->user->instID[0];
                  uStack_f94 = local_f98;
                  uStack_f90 = local_f98;
                  uStack_f8c = local_f98;
                  local_f88 = context->user->instPrimID[0];
                  uStack_f84 = local_f88;
                  uStack_f80 = local_f88;
                  uStack_f7c = local_f88;
                  *(float *)(ray + k * 4 + 0x80) = local_1108[lVar19];
                  local_11f8 = *local_11e0;
                  args.valid = (int *)local_11f8;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.context = context->user;
                  args.hit = local_1008;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&args);
                  }
                  if (local_11f8 == (undefined1  [16])0x0) {
                    auVar62._8_4_ = 0xffffffff;
                    auVar62._0_8_ = 0xffffffffffffffff;
                    auVar62._12_4_ = 0xffffffff;
                    auVar62 = auVar62 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&args);
                    }
                    auVar51._0_4_ = -(uint)(local_11f8._0_4_ == 0);
                    auVar51._4_4_ = -(uint)(local_11f8._4_4_ == 0);
                    auVar51._8_4_ = -(uint)(local_11f8._8_4_ == 0);
                    auVar51._12_4_ = -(uint)(local_11f8._12_4_ == 0);
                    auVar62 = auVar51 ^ _DAT_01f7ae20;
                    if (local_11f8 != (undefined1  [16])0x0) {
                      auVar43 = blendvps(*(undefined1 (*) [16])args.hit,
                                         *(undefined1 (*) [16])(args.ray + 0xc0),auVar51);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar43;
                      auVar43 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                         *(undefined1 (*) [16])(args.ray + 0xd0),auVar51);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar43;
                      auVar43 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                         *(undefined1 (*) [16])(args.ray + 0xe0),auVar51);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar43;
                      auVar43 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                         *(undefined1 (*) [16])(args.ray + 0xf0),auVar51);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar43;
                      auVar43 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                         *(undefined1 (*) [16])(args.ray + 0x100),auVar51);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar43;
                      auVar43 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                         *(undefined1 (*) [16])(args.ray + 0x110),auVar51);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar43;
                      auVar43 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                         *(undefined1 (*) [16])(args.ray + 0x120),auVar51);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar43;
                      auVar43 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                         *(undefined1 (*) [16])(args.ray + 0x130),auVar51);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar43;
                      auVar43 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                         *(undefined1 (*) [16])(args.ray + 0x140),auVar51);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar43;
                    }
                  }
                  if ((_DAT_01f7bb20 & auVar62) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar88;
                  }
                  else {
                    fVar88 = *(float *)(ray + k * 4 + 0x80);
                  }
                  valid.field_0.v[lVar19] = 0.0;
                  valid.field_0.i[0] = -(uint)(fVar138 <= fVar88) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar145 <= fVar88) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar110 <= fVar88) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar132 <= fVar88) & valid.field_0.i[3];
                }
                uVar16 = (undefined4)((ulong)lVar19 >> 0x20);
                iVar15 = movmskps((int)lVar19,(undefined1  [16])valid.field_0);
                uVar25 = CONCAT44(uVar16,iVar15);
                if (iVar15 == 0) goto LAB_00255698;
                auVar11._4_4_ = fVar145;
                auVar11._0_4_ = fVar138;
                auVar11._8_4_ = fVar110;
                auVar11._12_4_ = fVar132;
                auVar33 = blendvps(_DAT_01f7a9f0,auVar11,(undefined1  [16])valid.field_0);
                auVar86._4_4_ = auVar33._0_4_;
                auVar86._0_4_ = auVar33._4_4_;
                auVar86._8_4_ = auVar33._12_4_;
                auVar86._12_4_ = auVar33._8_4_;
                auVar43 = minps(auVar86,auVar33);
                auVar63._0_8_ = auVar43._8_8_;
                auVar63._8_4_ = auVar43._0_4_;
                auVar63._12_4_ = auVar43._4_4_;
                auVar43 = minps(auVar63,auVar43);
                auVar64._0_8_ =
                     CONCAT44(-(uint)(auVar43._4_4_ == auVar33._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar43._0_4_ == auVar33._0_4_) & valid.field_0._0_4_);
                auVar64._8_4_ = -(uint)(auVar43._8_4_ == auVar33._8_4_) & valid.field_0._8_4_;
                auVar64._12_4_ = -(uint)(auVar43._12_4_ == auVar33._12_4_) & valid.field_0._12_4_;
                iVar15 = movmskps(iVar15,auVar64);
                aVar52 = valid.field_0;
                if (iVar15 != 0) {
                  aVar52.i[2] = auVar64._8_4_;
                  aVar52._0_8_ = auVar64._0_8_;
                  aVar52.i[3] = auVar64._12_4_;
                }
                uVar17 = movmskps(iVar15,(undefined1  [16])aVar52);
                uVar25 = CONCAT44(uVar16,uVar17);
                lVar19 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                goto LAB_002551a1;
              }
            }
          }
LAB_00255698:
          uVar26 = uVar26 + 1;
        } while (uVar26 != local_11d8);
      }
      uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar43._4_4_ = uVar16;
      auVar43._0_4_ = uVar16;
      auVar43._8_4_ = uVar16;
      auVar43._12_4_ = uVar16;
      fVar31 = local_1068;
      fVar32 = fStack_1064;
      fVar53 = fStack_1060;
      fVar88 = fStack_105c;
      fVar54 = local_1078;
      fVar55 = fStack_1074;
      fVar56 = fStack_1070;
      fVar110 = fStack_106c;
      fVar57 = local_10a8;
      fVar59 = fStack_10a4;
      fVar65 = fStack_10a0;
      fVar145 = fStack_109c;
      fVar66 = local_10b8;
      fVar67 = fStack_10b4;
      fVar68 = fStack_10b0;
      fVar150 = fStack_10ac;
      fVar76 = local_10c8;
      fVar77 = fStack_10c4;
      fVar78 = fStack_10c0;
      fVar151 = fStack_10bc;
      fVar87 = local_1058;
      fVar92 = fStack_1054;
      fVar98 = fStack_1050;
      fVar58 = fStack_104c;
      fVar99 = local_1088;
      fVar100 = fStack_1084;
      fVar105 = fStack_1080;
      fVar132 = fStack_107c;
      fVar108 = local_1098;
      fVar109 = fStack_1094;
      fVar111 = fStack_1090;
      fVar138 = fStack_108c;
    }
    if (pSVar18 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }